

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

usize __thiscall Console::Prompt::Private::getScreenWidth(Private *this)

{
  usize *puVar1;
  int iVar2;
  ssize_t sVar3;
  usize uVar4;
  char *__buf;
  usize uVar5;
  usize newX;
  usize x;
  String moveCmd;
  usize newY;
  usize y;
  winsize ws;
  ulong local_60;
  ulong local_58;
  String local_50;
  usize local_28;
  usize local_20;
  undefined1 local_18 [2];
  ushort local_16;
  
  iVar2 = ioctl(originalStdout,0x5413,local_18);
  if (local_16 == 0 || iVar2 != 0) {
    getCursorPosition(this,&local_58,&local_20);
    sVar3 = write(originalStdout,"\x1b[999C",6);
    uVar4 = 0x50;
    if (sVar3 == 6) {
      getCursorPosition(this,&local_60,&local_28);
      if (local_58 < local_60) {
        local_50.data = &String::emptyData.super_Data;
        String::printf(&local_50,"\x1b[%dD",(ulong)(uint)((int)local_60 - (int)local_58));
        iVar2 = originalStdout;
        __buf = String::operator_cast_to_char_(&local_50);
        uVar5 = write(iVar2,__buf,(local_50.data)->len);
        uVar4 = (local_50.data)->len;
        if ((local_50.data)->ref != 0) {
          LOCK();
          puVar1 = &(local_50.data)->ref;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          if ((*puVar1 == 0) && (local_50.data != (Data *)0x0)) {
            operator_delete__(local_50.data);
          }
        }
        if (uVar5 != uVar4) {
          return 0x50;
        }
      }
      uVar4 = local_60 + 1;
    }
  }
  else {
    uVar4 = (usize)local_16;
  }
  return uVar4;
}

Assistant:

usize getScreenWidth()
  {
#ifdef _MSC_VER
    CONSOLE_SCREEN_BUFFER_INFO csbi;
    VERIFY(GetConsoleScreenBufferInfo(hOriginalStdOut, &csbi));
    return csbi.dwSize.X;
#else
    winsize ws;
    if(ioctl(originalStdout, TIOCGWINSZ, &ws) == 0)
      if(ws.ws_col)
        return ws.ws_col;
    usize x, y;
    getCursorPosition(x, y);
    if(write(originalStdout, "\x1b[999C", 6) != 6)
      return 80;
    usize newX, newY;
    getCursorPosition(newX, newY);
    if(newX > x)
    {
      String moveCmd;
      moveCmd.printf("\x1b[%dD", (int)(newX - x));
      if(write(originalStdout, (const char*)moveCmd, moveCmd.length()) != (ssize)moveCmd.length())
        return 80;
    }
    return newX + 1;
#endif
  }